

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

long difftm(tm_conflict1 *a,tm_conflict1 *b)

{
  int iVar1;
  int iVar2;
  int days;
  int by;
  int ay;
  tm_conflict1 *b_local;
  tm_conflict1 *a_local;
  
  iVar1 = a->tm_year + 0x76b;
  iVar2 = b->tm_year + 0x76b;
  return (long)((((a->tm_yday - b->tm_yday) + ((iVar1 >> 2) - (iVar2 >> 2))) -
                (iVar1 / 100 - iVar2 / 100)) + ((iVar1 / 100 >> 2) - (iVar2 / 100 >> 2)) +
               (iVar1 - iVar2) * 0x16d) * 0x15180 + (long)(a->tm_hour - b->tm_hour) * 0xe10 +
         (long)(a->tm_min - b->tm_min) * 0x3c + (long)(a->tm_sec - b->tm_sec);
}

Assistant:

static long
difftm (struct tm *a, struct tm *b)
{
	int ay = a->tm_year + (TM_YEAR_ORIGIN - 1);
	int by = b->tm_year + (TM_YEAR_ORIGIN - 1);
	int days = (
		/* difference in day of year */
		a->tm_yday - b->tm_yday
		/* + intervening leap days */
		+  ((ay >> 2) - (by >> 2))
		-  (ay/100 - by/100)
		+  ((ay/100 >> 2) - (by/100 >> 2))
		/* + difference in years * 365 */
		+  (long)(ay-by) * 365
		);
	return (days * DAY + (a->tm_hour - b->tm_hour) * HOUR
	    + (a->tm_min - b->tm_min) * MINUTE
	    + (a->tm_sec - b->tm_sec));
}